

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O3

_Bool ra_range_uint32_array(roaring_array_t *ra,size_t offset,size_t limit,uint32_t *ans)

{
  uint8_t uVar1;
  int iVar2;
  void *__s;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  array_container_t *cont;
  void *local_80;
  ulong local_68;
  long local_60;
  
  if (0 < ra->size) {
    lVar8 = 0;
    uVar3 = 0;
    local_68 = 0;
    local_80 = (void *)0x0;
    local_60 = 0;
    bVar7 = false;
    lVar4 = 0;
    uVar5 = 0;
    do {
      cont = (array_container_t *)ra->containers[lVar8];
      uVar1 = ra->typecodes[lVar8];
      if (uVar1 == '\x04') {
        ra->typecodes[lVar8] = *(uint8_t *)&cont->array;
        cont = *(array_container_t **)cont;
        uVar1 = ra->typecodes[lVar8];
      }
      if (uVar1 == '\x03') {
        iVar2 = run_container_cardinality((run_container_t *)cont);
        lVar4 = (long)iVar2;
      }
      else if ((uVar1 == '\x02') || (uVar1 == '\x01')) {
        lVar4 = (long)cont->cardinality;
      }
      uVar6 = uVar5;
      if (uVar3 < offset + limit && offset <= (lVar4 + uVar3) - 1) {
        if (!bVar7) {
          local_60 = offset - uVar3;
          local_68 = local_60 + limit;
          local_80 = roaring_malloc(local_68 * 4);
          if (local_80 == (void *)0x0) {
            return false;
          }
          memset(local_80,0,local_68 * 4);
        }
        uVar6 = lVar4 + uVar5;
        if (local_68 < uVar6) {
          local_68 = local_68 + lVar4;
          __s = roaring_malloc(local_68 * 4);
          if (__s == (void *)0x0) {
            if (local_80 != (void *)0x0) {
              roaring_free(local_80);
            }
            return false;
          }
          memset(__s,0,local_68 * 4);
          memcpy(__s,local_80,uVar5 * 4);
          roaring_free(local_80);
          local_80 = __s;
        }
        uVar1 = ra->typecodes[lVar8];
        bVar7 = true;
        if (uVar1 == '\x03') {
          run_container_to_uint32_array
                    ((void *)((long)local_80 + uVar5 * 4),(run_container_t *)cont,
                     (uint)ra->keys[lVar8] << 0x10);
        }
        else if (uVar1 == '\x02') {
          array_container_to_uint32_array
                    ((void *)((long)local_80 + uVar5 * 4),cont,(uint)ra->keys[lVar8] << 0x10);
        }
        else if (uVar1 == '\x01') {
          bitset_container_to_uint32_array
                    ((uint32_t *)((long)local_80 + uVar5 * 4),(bitset_container_t *)cont,
                     (uint)ra->keys[lVar8] << 0x10);
        }
      }
      if (limit <= uVar6 - local_60) break;
      uVar3 = uVar3 + lVar4;
      lVar8 = lVar8 + 1;
      uVar5 = uVar6;
    } while (lVar8 < ra->size);
    if (local_80 != (void *)0x0) {
      memcpy(ans,(void *)((long)local_80 + local_60 * 4),limit << 2);
      free(local_80);
    }
  }
  return true;
}

Assistant:

bool ra_range_uint32_array(const roaring_array_t *ra, size_t offset,
                           size_t limit, uint32_t *ans) {
    size_t ctr = 0;
    size_t dtr = 0;

    size_t t_limit = 0;

    bool first = false;
    size_t first_skip = 0;

    uint32_t *t_ans = NULL;
    size_t cur_len = 0;

    for (int i = 0; i < ra->size; ++i) {
        const container_t *c =
            container_unwrap_shared(ra->containers[i], &ra->typecodes[i]);
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                t_limit = (const_CAST_bitset(c))->cardinality;
                break;
            case ARRAY_CONTAINER_TYPE:
                t_limit = (const_CAST_array(c))->cardinality;
                break;
            case RUN_CONTAINER_TYPE:
                t_limit = run_container_cardinality(const_CAST_run(c));
                break;
        }
        if (ctr + t_limit - 1 >= offset && ctr < offset + limit) {
            if (!first) {
                // first_skip = t_limit - (ctr + t_limit - offset);
                first_skip = offset - ctr;
                first = true;
                t_ans = (uint32_t *)roaring_malloc(sizeof(*t_ans) *
                                                   (first_skip + limit));
                if (t_ans == NULL) {
                    return false;
                }
                memset(t_ans, 0, sizeof(*t_ans) * (first_skip + limit));
                cur_len = first_skip + limit;
            }
            if (dtr + t_limit > cur_len) {
                uint32_t *append_ans = (uint32_t *)roaring_malloc(
                    sizeof(*append_ans) * (cur_len + t_limit));
                if (append_ans == NULL) {
                    if (t_ans != NULL) roaring_free(t_ans);
                    return false;
                }
                memset(append_ans, 0,
                       sizeof(*append_ans) * (cur_len + t_limit));
                cur_len = cur_len + t_limit;
                memcpy(append_ans, t_ans, dtr * sizeof(uint32_t));
                roaring_free(t_ans);
                t_ans = append_ans;
            }
            switch (ra->typecodes[i]) {
                case BITSET_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_bitset(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
                case ARRAY_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_array(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
                case RUN_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_run(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
            }
            dtr += t_limit;
        }
        ctr += t_limit;
        if (dtr - first_skip >= limit) break;
    }
    if (t_ans != NULL) {
        memcpy(ans, t_ans + first_skip, limit * sizeof(uint32_t));
        free(t_ans);
    }
    return true;
}